

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_decrypt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *deckey32,
              uchar *adaptor_sig162)

{
  uchar *puVar1;
  uchar *puVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *p;
  uint uVar7;
  uint uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  int vflag;
  int overflow;
  secp256k1_scalar sigr;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  secp256k1_scalar local_70;
  secp256k1_scalar local_50;
  
  local_98.d[0] = 0;
  local_98.d[1] = 0;
  local_98.d[2] = 0;
  local_98.d[3] = 0;
  secp256k1_scalar_set_b32(&local_50,deckey32,&local_cc);
  lVar9 = 0;
  uVar4 = secp256k1_ecdsa_adaptor_sig_deserialize
                    ((secp256k1_ge *)0x0,&local_b8,(secp256k1_ge *)0x0,&local_98,
                     (secp256k1_scalar *)0x0,(secp256k1_scalar *)0x0,adaptor_sig162);
  if (local_cc != 0) {
    uVar4 = 0;
  }
  local_c8 = local_50.d[2] | local_50.d[0];
  uStack_c0 = local_50.d[3] | local_50.d[1];
  secp256k1_scalar_inverse(&local_70,&local_50);
  secp256k1_scalar_mul(&local_70,&local_70,&local_98);
  uVar5 = (uint)(local_70.d[3] >> 0x3f);
  uVar6 = uVar5 ^ 1;
  uVar7 = uVar6;
  if (local_70.d[2] == 0xffffffffffffffff) {
    uVar7 = 0;
  }
  if (0x5d576e7357a4501c < local_70.d[1]) {
    uVar6 = 0;
  }
  uVar6 = (uVar6 | uVar7 | local_70.d[3] < 0x7fffffffffffffff) ^ 1;
  uVar7 = 0;
  if (0xdfe92f46681b20a0 < local_70.d[0]) {
    uVar7 = uVar6;
  }
  auVar10._0_4_ = -(uint)((int)local_c8 == 0);
  auVar10._4_4_ = -(uint)(local_c8._4_4_ == 0);
  auVar10._8_4_ = -(uint)((int)uStack_c0 == 0);
  auVar10._12_4_ = -(uint)(uStack_c0._4_4_ == 0);
  uVar8 = movmskps((int)&local_98,auVar10);
  if (0x5d576e7357a4501d < local_70.d[1]) {
    uVar7 = uVar6;
  }
  uVar6 = uVar8 ^ 0xf;
  if ((uVar8 ^ 0xf) != 0) {
    uVar6 = uVar4;
  }
  secp256k1_scalar_cond_negate(&local_70,uVar7 | uVar5);
  *(uint64_t *)sig->data = local_b8.d[0];
  *(uint64_t *)(sig->data + 8) = local_b8.d[1];
  *(uint64_t *)(sig->data + 0x10) = local_b8.d[2];
  *(uint64_t *)(sig->data + 0x18) = local_b8.d[3];
  *(uint64_t *)(sig->data + 0x20) = local_70.d[0];
  *(uint64_t *)(sig->data + 0x28) = local_70.d[1];
  *(uint64_t *)(sig->data + 0x30) = local_70.d[2];
  *(uint64_t *)(sig->data + 0x38) = local_70.d[3];
  cVar3 = ((byte)uVar6 ^ 1) - 1;
  auVar10 = ZEXT216(CONCAT11(cVar3,cVar3));
  auVar10 = pshuflw(auVar10,auVar10,0);
  uVar4 = auVar10._0_4_;
  do {
    puVar1 = sig->data + lVar9;
    uVar7 = *(uint *)(puVar1 + 4);
    uVar5 = *(uint *)(puVar1 + 8);
    uVar8 = *(uint *)(puVar1 + 0xc);
    puVar2 = sig->data + lVar9;
    *(uint *)puVar2 = *(uint *)puVar1 & uVar4;
    *(uint *)(puVar2 + 4) = uVar7 & uVar4;
    *(uint *)(puVar2 + 8) = uVar5 & uVar4;
    *(uint *)(puVar2 + 0xc) = uVar8 & uVar4;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x40);
  return uVar6;
}

Assistant:

int secp256k1_ecdsa_adaptor_decrypt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *deckey32, const unsigned char *adaptor_sig162) {
    secp256k1_scalar deckey;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    int high;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);

    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_set_b32(&deckey, deckey32, &overflow);
    ret &= !overflow;
    ret &= secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, NULL, &sp, NULL, NULL, adaptor_sig162);
    ret &= !secp256k1_scalar_is_zero(&deckey);
    secp256k1_scalar_inverse(&s, &deckey);
    /* s = s' * y⁻¹ */
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);
    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    secp256k1_memczero(&sig->data[0], 64, !ret);
    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}